

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  char **ppcVar8;
  char *pattern;
  uint uVar9;
  ulong uVar10;
  
  lafe_setprogname(*argv,"bsdunzip");
  pcVar4 = setlocale(6,"");
  if (pcVar4 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  iVar1 = isatty(1);
  if (iVar1 != 0) {
    tty = 1;
  }
  pcVar4 = getenv("UNZIP_DEBUG");
  if (pcVar4 != (char *)0x0) {
    unzip_debug = 1;
  }
  if (0 < argc) {
    uVar6 = 0;
    do {
      uVar5 = 10;
      if ((long)uVar6 < (long)(argc + -1)) {
        uVar5 = 0x20;
      }
      debug("%s%c",argv[uVar6],uVar5);
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  setenv("POSIXLY_CORRECT","",1);
  iVar1 = getopts(argc,argv);
  if (version_opt == '\0') {
    if ((zipinfo_mode == '\x01') && ((Z1_opt & 1) == 0)) {
      puts("Zipinfo mode needs additional options");
    }
    else {
      if (iVar1 < argc) {
        pcVar4 = argv[iVar1];
        iVar2 = strcmp(pcVar4,"-");
        unzip_exclude_mode = '\0';
        if ((iVar1 + 1 < argc) && (pattern = argv[(long)iVar1 + 1], *pattern != '-')) {
          ppcVar8 = argv + (long)iVar1 + 2;
          iVar3 = iVar1;
          do {
            add_pattern(&include,pattern);
            iVar1 = argc + -1;
            if (argc + -2 == iVar3) break;
            pattern = *ppcVar8;
            iVar1 = iVar3 + 1;
            ppcVar8 = ppcVar8 + 1;
            iVar3 = iVar1;
          } while (*pattern != '-');
        }
        iVar3 = getopts(argc - iVar1,argv + iVar1);
        uVar9 = iVar1 + iVar3;
        if (unzip_exclude_mode == '\x01') {
          uVar6 = (ulong)uVar9;
          if ((int)uVar9 < argc) {
            uVar10 = (ulong)(int)uVar9;
            do {
              ppcVar8 = argv + uVar10;
              uVar6 = uVar10;
              if (**ppcVar8 == '-') break;
              uVar10 = uVar10 + 1;
              add_pattern(&exclude,*ppcVar8);
              uVar6 = (ulong)(uint)argc;
            } while ((long)uVar10 < (long)argc);
          }
          iVar1 = (int)uVar6;
          iVar3 = getopts(argc - (iVar1 + -1),argv + (long)iVar1 + -1);
          uVar9 = (iVar3 + iVar1) - 1;
        }
        if ((int)uVar9 < argc) {
          lVar7 = 0;
          do {
            add_pattern(&include,argv[(int)uVar9 + lVar7]);
            lVar7 = lVar7 + 1;
          } while (argc - uVar9 != (int)lVar7);
        }
        if (1 < (uint)u_opt + (uint)o_opt + (uint)n_opt) {
          errorx("-n, -o and -u are contradictory");
        }
        if (iVar2 == 0) {
          pcVar4 = (char *)0x0;
        }
        unzip(pcVar4);
        goto LAB_00103cae;
      }
      fwrite("Usage: unzip [-aCcfjLlnopqtuvyZ1] [{-O|-I} encoding] [-d dir] [-x pattern] [-P password] zipfile\n             [member ...]\n"
             ,0x7b,1,_stderr);
    }
    exit(1);
  }
  pcVar4 = archive_version_details();
  printf("bsdunzip %s - %s \n","3.8.0",pcVar4);
LAB_00103cae:
  exit(0);
}

Assistant:

int
main(int argc, char *argv[])
{
	const char *zipfile;
	int nopts;

	lafe_setprogname(*argv, "bsdunzip");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	if (isatty(STDOUT_FILENO))
		tty = 1;

	if (getenv("UNZIP_DEBUG") != NULL)
		unzip_debug = 1;
	for (int i = 0; i < argc; ++i)
		debug("%s%c", argv[i], (i < argc - 1) ? ' ' : '\n');

#ifdef __GLIBC__
	/* Prevent GNU getopt(3) from rearranging options. */
	setenv("POSIXLY_CORRECT", "", 1);
#endif
	/*
	 * Info-ZIP's unzip(1) expects certain options to come before the
	 * zipfile name, and others to come after - though it does not
	 * enforce this.  For simplicity, we accept *all* options both
	 * before and after the zipfile name.
	 */
	nopts = getopts(argc, argv);

	if (version_opt == 1)
		version();

	/*
	 * When more of the zipinfo mode options are implemented, this
	 * will need to change.
	 */
	if (zipinfo_mode && !Z1_opt) {
		printf("Zipinfo mode needs additional options\n");
		exit(EXIT_FAILURE);
	}

	if (argc <= nopts)
		usage();
	zipfile = argv[nopts++];

	if (strcmp(zipfile, "-") == 0)
		zipfile = NULL; /* STDIN */

	unzip_exclude_mode = 0;

	while (nopts < argc && *argv[nopts] != '-')
		add_pattern(&include, argv[nopts++]);

	nopts--; /* fake argv[0] */
	nopts += getopts(argc - nopts, argv + nopts);

	/*
	 * For compatibility with Info-ZIP's unzip(1) we need to treat
	 * non-option arguments following an -x after the zipfile as
	 * exclude list members.
	 */
	if (unzip_exclude_mode) {
		while (nopts < argc && *argv[nopts] != '-')
			add_pattern(&exclude, argv[nopts++]);
		nopts--; /* fake argv[0] */
		nopts += getopts(argc - nopts, argv + nopts);
	}

	/* There may be residual arguments if we encountered -- */
	while (nopts < argc)
		add_pattern(&include, argv[nopts++]);

	if (n_opt + o_opt + u_opt > 1)
		errorx("-n, -o and -u are contradictory");

	unzip(zipfile);

	exit(EXIT_SUCCESS);
}